

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O3

int __thiscall UEFIFind::init(UEFIFind *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  USTATUS UVar3;
  UByteArray buffer;
  UByteArray local_38;
  
  paVar1 = &local_38.d.field_2;
  local_38.d._M_string_length = 0;
  local_38.d.field_2._M_local_buf[0] = '\0';
  local_38.d._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = readFileIntoBuffer((CBString *)ctx,&local_38);
  UVar3 = 5;
  if (bVar2) {
    UVar3 = FfsParser::parse(this->ffsParser,&local_38);
    if (UVar3 == 0) {
      this->initDone = true;
      UVar3 = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.d._M_dataplus._M_p != paVar1) {
    operator_delete(local_38.d._M_dataplus._M_p);
  }
  return (int)UVar3;
}

Assistant:

USTATUS UEFIFind::init(const UString & path)
{
    UByteArray buffer;
    if (false == readFileIntoBuffer(path, buffer))
        return U_FILE_OPEN;

    USTATUS result = ffsParser->parse(buffer);
    if (result)
        return result;

    initDone = true;
    return U_SUCCESS;
}